

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

LengthPercentage
Rml::ComputeMaxSize(Property *property,float font_size,float document_font_size,float dp_ratio,
                   Vector2f vp_dimensions)

{
  NumericValue value;
  ulong uVar1;
  float fVar2;
  
  if ((property->unit & KEYWORD) == UNKNOWN) {
    if ((property->unit & PERCENT) != UNKNOWN) {
      fVar2 = Property::Get<float>(property);
      uVar1 = 1;
      goto LAB_00254e4c;
    }
    value = Property::GetNumericValue(property);
    fVar2 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
    fVar2 = (float)(-(uint)(fVar2 < 0.0) & 0x7f7fffff | ~-(uint)(fVar2 < 0.0) & (uint)fVar2);
  }
  else {
    fVar2 = 3.4028235e+38;
  }
  uVar1 = 0;
LAB_00254e4c:
  return (LengthPercentage)((ulong)(uint)fVar2 << 0x20 | uVar1);
}

Assistant:

Style::LengthPercentage ComputeMaxSize(const Property* property, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	using namespace Style;
	if (Any(property->unit & Unit::KEYWORD))
		return LengthPercentage(LengthPercentage::Length, FLT_MAX);
	else if (Any(property->unit & Unit::PERCENT))
		return LengthPercentage(LengthPercentage::Percentage, property->Get<float>());

	const float length = ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions);
	return LengthPercentage(LengthPercentage::Length, length < 0.f ? FLT_MAX : length);
}